

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOManager.cpp
# Opt level: O1

Mat * IOManager::secret_share_kv_data(int *data,int size,string *prefix,bool isFreq)

{
  undefined1 v [16];
  ostream *poVar1;
  long *plVar2;
  undefined8 *puVar3;
  ll lVar4;
  undefined7 in_register_00000009;
  ulong *puVar5;
  long *plVar6;
  Mat *pMVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  vector<long_long,_std::allocator<long_long>_> coefficients;
  string filename;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  out_files;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar12;
  vector<long_long,_std::allocator<long_long>_> local_138;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  Mat *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  undefined4 local_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  int *local_90;
  string *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_60;
  vector<long_long,_std::allocator<long_long>_> local_48;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000009,isFreq);
  local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = data;
  local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::vector(&local_60,3,(allocator_type *)&local_b0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," size: ",7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,size);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  puVar3 = (undefined8 *)operator_new__(0x80);
  *puVar3 = 3;
  pMVar7 = (Mat *)(puVar3 + 1);
  lVar9 = 0;
  local_100 = pMVar7;
  do {
    Mat::Mat(pMVar7);
    lVar9 = lVar9 + -0x28;
    pMVar7 = pMVar7 + 1;
  } while (lVar9 != -0x78);
  lVar9 = 0;
  lVar10 = 0;
  pMVar7 = local_100;
  local_88 = prefix;
  do {
    Mat::init(pMVar7,(EVP_PKEY_CTX *)0x1);
    std::operator+(&local_80,"output/",local_88);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
    puVar5 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar5) {
      local_c0 = *puVar5;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar5;
      local_d0 = (ulong *)*plVar2;
    }
    local_c8 = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8,1,(uint)lVar10);
    uVar8 = 0xf;
    if (local_d0 != &local_c0) {
      uVar8 = local_c0;
    }
    if (uVar8 < (ulong)(local_f0 + local_c8)) {
      uVar8 = 0xf;
      if (local_f8 != local_e8) {
        uVar8 = local_e8[0];
      }
      if (uVar8 < (ulong)(local_f0 + local_c8)) goto LAB_00119a24;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00119a24:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f8);
    }
    local_120 = &local_110;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_110 = *plVar2;
      uStack_108 = puVar3[3];
    }
    else {
      local_110 = *plVar2;
      local_120 = (long *)*puVar3;
    }
    local_118 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_a0 = *plVar6;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar6;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8,local_e8[0] + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File: ",6);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_b0,local_a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::ofstream::open((string *)
                        (local_60.
                         super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),(_Ios_Openmode)&local_b0
                       );
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    lVar10 = lVar10 + 1;
    pMVar7 = pMVar7 + 1;
    lVar9 = lVar9 + 0x200;
    if (lVar10 == 3) {
      lVar4 = Constant::Util::randomlong();
      local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start[1] = lVar4;
      if (0 < size) {
        uVar12 = 0;
        lVar9 = 0;
        do {
          lVar4 = Constant::Util::randomlong();
          local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[1] = lVar4;
          uVar8 = (ulong)(0 < (long)local_90[lVar9]);
          if ((char)local_d4 == '\0') {
            uVar8 = (long)local_90[lVar9];
          }
          *local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start = uVar8 << 0x14;
          lVar10 = 2;
          lVar11 = 0;
          pMVar7 = local_100;
          do {
            std::vector<long_long,_std::allocator<long_long>_>::vector(&local_48,&local_138);
            operator_delete(local_48.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<long_long,_std::allocator<long_long>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<long_long,_std::allocator<long_long>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            poVar1 = std::ostream::_M_insert<long_long>
                               ((longlong)
                                (local_60.
                                 super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar11));
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
            v._8_4_ = size;
            v._0_8_ = in_stack_fffffffffffffeb8;
            v._12_4_ = uVar12;
            Mat::setVal(pMVar7,(int)lVar9,(ll128)v);
            lVar10 = lVar10 + 1;
            pMVar7 = pMVar7 + 1;
            lVar11 = lVar11 + 0x200;
          } while (lVar10 != 5);
          lVar9 = lVar9 + 1;
        } while (lVar9 != CONCAT44(uVar12,size));
      }
      std::
      vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::~vector(&local_60);
      if (local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_138.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return local_100;
    }
  } while( true );
}

Assistant:

Mat* IOManager::secret_share_kv_data(int* data, int size, string prefix, bool isFreq) {
    vector<ll> coefficients(TN);
    vector<ofstream> out_files(M);
    cout << prefix << " size: " << size << endl;

    Mat* res = new Mat[M];
//    Mat res(1, size);
    for (int i = 0; i < M; ++i) {
        res[i].init(1, size);
        string filename = "output/"+prefix+"_"+to_string(i)+".csv";
        cout << "File: " << filename << endl;
        out_files[i].open(filename, ios::out);
    }
    /// 简化计算，TODO，delete
    for (int j = 1; j < TN; ++j) {
        coefficients[j] = Constant::Util::randomlong();
    }
//    for (int j = 0; j < TN; ++j) {
//        cout << j << ": " << coefficients[j] << endl;
//    }
    for (int i = 0; i < size; ++i) {
        for (int j = 1; j < TN; ++j) {
            coefficients[j] = Constant::Util::randomlong();
        }
        if (isFreq) {
            if (data[i] > 0) {
                coefficients[0] = IE;
            } else {
                coefficients[0] = 0;
            }
        } else {
            coefficients[0] = data[i] * IE;
        }

        for (int k = 0; k < M; ++k) {
            ll tmp = poly_eval(coefficients, k + 2);
            out_files[k] << tmp << ",";
            res[k].setVal(i, tmp);
//            if(k==node_type){
//                res.setVal(i, tmp);
//            }
        }
//        for (int l = 0; l < TN; ++l) {
//            DBGprint("%lld, ", coefficients[l]);
//        }
//        cout << endl;
    }
//    res[0].print();
    return res;
}